

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O2

void do_specialize(CHAR_DATA *ch,char *argument)

{
  short *psVar1;
  long *plVar2;
  PC_DATA *pPVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  CClass *this;
  char *txt;
  long lVar9;
  double dVar10;
  char buf [4608];
  
  bVar6 = is_npc(ch);
  if (bVar6) {
    return;
  }
  this = char_data::Class(ch);
  iVar7 = CClass::GetIndex(this);
  if (iVar7 == 1) {
    bVar6 = str_cmp(argument,"");
    if (!bVar6) {
      send_to_char("You can choose from the following specializations:\n\r",ch);
      for (lVar9 = 0x18; lVar9 != 0x78; lVar9 = lVar9 + 0x10) {
        lVar4 = *(long *)((long)&sphere_table[0x12].name + lVar9);
        uVar5 = ch->pcdata->styles[(int)(lVar4 / 0x20)];
        dVar10 = exp2((double)(lVar4 % 0x20));
        if ((uVar5 & (long)dVar10) == 0) {
          send_to_char(*(char **)((long)&style_table[0].bit + lVar9),ch);
          send_to_char("\n\r",ch);
        }
      }
      return;
    }
    if (ch->pcdata->special == 0) {
      txt = "You have no available specializations.\n\r";
    }
    else {
      iVar7 = style_lookup(argument);
      if (iVar7 != 0) {
        dVar10 = exp2((double)(style_table[iVar7].bit % 0x20));
        pPVar3 = ch->pcdata;
        plVar2 = pPVar3->styles + (int)style_table[iVar7].bit / 0x20;
        *plVar2 = *plVar2 | (long)dVar10;
        psVar1 = &pPVar3->special;
        *psVar1 = *psVar1 + -1;
        sprintf(buf,"You are now specialized in the %s fighting style.\n\r",style_table[iVar7].name)
        ;
        send_to_char(buf,ch);
        group_add(ch,style_table[iVar7].name,false);
        pPVar3 = ch->pcdata;
        iVar8 = skill_lookup(style_table[iVar7].name);
        pPVar3->learned[iVar8] = 2;
        if (ch->pcdata->style != 0) {
          return;
        }
        ch->pcdata->style = (short)iVar7;
        return;
      }
      txt = "That\'s not a valid style to specialize in.\n\r";
    }
  }
  else {
    txt = "Huh?\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_specialize(CHAR_DATA *ch, char *argument)
{
	int i, style = 0;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (ch->Class()->GetIndex() != CLASS_WARRIOR)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		send_to_char("You can choose from the following specializations:\n\r", ch);

		for (i = 1; i < MAX_STYLE; i++)
		{
			if (!IS_SET(ch->pcdata->styles, style_table[i].bit))
			{
				send_to_char(style_table[i].name, ch);
				send_to_char("\n\r", ch);
			}
		}

		return;
	}

	if (!ch->pcdata->special)
	{
		send_to_char("You have no available specializations.\n\r", ch);
		return;
	}

	style = style_lookup(argument);

	if (!style)
	{
		send_to_char("That's not a valid style to specialize in.\n\r", ch);
		return;
	}

	SET_BIT(ch->pcdata->styles, style_table[style].bit);
	ch->pcdata->special--;

	sprintf(buf, "You are now specialized in the %s fighting style.\n\r", style_table[style].name);
	send_to_char(buf, ch);

	group_add(ch, style_table[style].name, false);

	ch->pcdata->learned[skill_lookup(style_table[style].name)] = 2;

	if (ch->pcdata->style == 0)
		ch->pcdata->style = style;
}